

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O3

IterateResult __thiscall glcts::InterfaceMatchingCase::iterate(InterfaceMatchingCase *this)

{
  ostream *poVar1;
  TestType testType;
  glProgramUniform4fFunc p_Var2;
  RenderContext *pRVar3;
  glUniform4fFunc p_Var4;
  TextureFormat TVar5;
  TextureFormat TVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  GLuint GVar12;
  GLenum GVar13;
  uint uVar14;
  GLint GVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestError *pTVar16;
  ulong __n;
  long *plVar17;
  int height;
  char *pcVar18;
  void *pvVar19;
  long lVar20;
  long *plVar21;
  GLuint pipeline;
  GLuint indexBuf;
  GLuint vertexBuf;
  GLuint vao;
  Surface renderedFrame;
  GLuint value;
  string fragmentPrecision;
  string vertexPrecision;
  string frag;
  char *srcStrings [1];
  string vtx;
  string frag2;
  ShaderProgram progVF;
  stringstream str;
  PrecisionTests vertexPrecisionTests [7];
  PrecisionTests fragmentPrecisionTests [7];
  float position [16];
  GLuint local_680;
  GLuint local_67c;
  GLuint local_678;
  allocator<char> local_672;
  allocator<char> local_671;
  TextureFormat local_670;
  TestType local_668;
  GLuint local_664;
  GLuint local_660;
  GLuint local_65c;
  Surface local_658;
  int local_63c;
  long *local_638;
  ulong local_630;
  long local_628 [2];
  long *local_618;
  ulong local_610;
  long local_608 [2];
  char *local_5f8;
  undefined8 local_5f0;
  char local_5e8;
  undefined7 uStack_5e7;
  char *local_5d8;
  char *local_5d0;
  undefined8 local_5c8;
  char local_5c0;
  undefined7 uStack_5bf;
  value_type local_5b0;
  long local_590;
  long local_588;
  value_type local_580;
  undefined1 *local_560;
  undefined8 local_558;
  undefined1 local_550;
  undefined7 uStack_54f;
  Surface local_540;
  Surface local_528;
  undefined1 local_510 [152];
  GLuint local_478;
  bool local_450;
  undefined1 local_440 [8];
  undefined1 local_438 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_428 [4];
  ios_base local_3c8 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_3b0;
  undefined1 local_390 [216];
  TestType local_2b8 [2];
  undefined1 *local_2b0;
  long lStack_2a8;
  undefined1 local_2a0 [16];
  undefined4 local_290;
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined4 local_268;
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined4 local_240;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined4 local_218;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined4 local_1f0;
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined4 local_1c8;
  long *local_1c0 [2];
  long local_1b0 [3];
  TestType local_198 [2];
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  undefined4 local_170;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined4 local_148;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined4 local_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined4 local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined4 local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined4 local_a8;
  long *local_a0 [2];
  long local_90 [3];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  Functions *gl;
  
  local_670 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar10);
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar10 = *(int *)CONCAT44(extraout_var_00,iVar11);
  if (0xf < iVar10) {
    iVar10 = 0x10;
  }
  iVar11 = ((int *)CONCAT44(extraout_var_00,iVar11))[1];
  height = 0x10;
  if (iVar11 < 0x10) {
    height = iVar11;
  }
  tcu::Surface::Surface(&local_658,iVar10,height);
  local_5d0 = &local_5c0;
  local_5c8 = 0;
  local_5c0 = '\0';
  local_5f8 = &local_5e8;
  local_5f0 = 0;
  local_5e8 = '\0';
  local_560 = &local_550;
  local_558 = 0;
  local_550 = 0;
  (*gl->viewport)(0,0,iVar10,height);
  (*gl->clearColor)(0.0,0.0,0.0,0.0);
  (*gl->clear)(0x4000);
  local_48 = 0x3f8000003f800000;
  uStack_40 = 0x3f800000bf800000;
  local_58 = 0xbf8000003f800000;
  uStack_50 = 0x3f80000000000000;
  local_68 = 0x3f800000bf800000;
  uStack_60 = 0x3f80000000000000;
  local_78 = 0xbf800000bf800000;
  uStack_70 = 0x3f8000003f800000;
  (*gl->genVertexArrays)(1,&local_65c);
  (*gl->bindVertexArray)(local_65c);
  (*gl->genBuffers)(1,&local_664);
  (*gl->bindBuffer)(0x8893,local_664);
  (*gl->bufferData)(0x8893,0xc,iterate::quadIndices,0x88e4);
  (*gl->genBuffers)(1,&local_660);
  (*gl->bindBuffer)(0x8892,local_660);
  (*gl->bufferData)(0x8892,0x40,&local_78,0x88e4);
  (*gl->genProgramPipelines)(1,&local_680);
  (*gl->bindProgramPipeline)(local_680);
  local_2b8[0] = DEFAULT_PRECISION;
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"highp","");
  local_290 = 1;
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"highp","");
  local_268 = 1;
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"mediump","");
  local_240 = 1;
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"lowp","");
  local_218 = 2;
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"highp","");
  local_1f0 = 2;
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"mediump","");
  local_1c8 = 2;
  plVar17 = local_1b0;
  local_1c0[0] = plVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"lowp","");
  local_190 = local_180;
  local_198[0] = DEFAULT_PRECISION;
  local_188 = 0;
  local_180[0] = 0;
  local_170 = 1;
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"highp","");
  local_148 = 1;
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"mediump","");
  local_120 = 1;
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"lowp","");
  local_f8 = 2;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"highp","");
  local_d0 = 2;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"mediump","");
  local_a8 = 2;
  plVar21 = local_90;
  local_a0[0] = plVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"lowp","");
  lVar20 = 0;
  do {
    local_618 = local_608;
    local_590 = lVar20;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_618,(&local_2b0)[lVar20 * 5],
               (&local_2b0)[lVar20 * 5] + (&lStack_2a8)[lVar20 * 5]);
    local_668 = local_2b8[lVar20 * 10];
    lVar20 = 0;
    do {
      local_638 = local_628;
      local_588 = lVar20;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_638,(&local_190)[lVar20 * 5],
                 (&local_190)[lVar20 * 5] + *(long *)(local_180 + lVar20 * 0x28 + -8));
      if (local_630 != 0) {
        testType = local_198[lVar20 * 10];
        local_440._0_4_ = local_670.order;
        local_440._4_4_ = local_670.type;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_438,"vertex shader precision: ",0x19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_438,(char *)local_618,local_610);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_438,", shader test mode: ",0x14);
        getTestTypeName_abi_cxx11_((string *)local_510,this,local_668);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_438,(char *)local_510._0_8_,local_510._8_8_);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_440,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_510._0_8_ != (long)local_510 + 0x10) {
          operator_delete((void *)local_510._0_8_,local_510._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
        std::ios_base::~ios_base(local_3c8);
        local_440._0_4_ = local_670.order;
        local_440._4_4_ = local_670.type;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_438,"fragment shader precision: ",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_438,(char *)local_638,local_630);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_438,", shader test mode: ",0x14);
        getTestTypeName_abi_cxx11_((string *)local_510,this,testType);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_438,(char *)local_510._0_8_,local_510._8_8_);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_440,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if (local_510._0_8_ != (long)local_510 + 0x10) {
          operator_delete((void *)local_510._0_8_,local_510._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
        std::ios_base::~ios_base(local_3c8);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                  (this,&local_5d0,(ulong)this->m_glslVersion,&local_618,(ulong)local_668);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                  (this,&local_5f8,(ulong)this->m_glslVersion,&local_638);
        local_5d8 = local_5d0;
        GVar12 = (*gl->createShaderProgramv)(0x8b31,1,&local_5d8);
        bVar9 = checkCSProg(this,gl,GVar12,1);
        if (!bVar9) {
          pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar16,"CreateShaderProgramv failed for vertex shader",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0xaac);
LAB_00be6a96:
          __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        local_5d8 = local_5f8;
        local_678 = (*gl->createShaderProgramv)(0x8b30,1,&local_5d8);
        bVar9 = checkCSProg(this,gl,local_678,1);
        if (!bVar9) {
          pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar16,"CreateShaderProgramv failed for fragment shader",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0xab2);
          goto LAB_00be6a96;
        }
        (*gl->useProgramStages)(local_680,1,GVar12);
        (*gl->useProgramStages)(local_680,2,local_678);
        GVar13 = (*gl->getError)();
        glu::checkError(GVar13,"InterfaceMatching failure",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0xab7);
        (*gl->validateProgramPipeline)(local_680);
        (*gl->getProgramPipelineiv)(local_680,0x8b83,&local_63c);
        uVar8 = local_610;
        uVar7 = local_630;
        __n = local_630;
        if (local_610 < local_630) {
          __n = local_610;
        }
        local_67c = GVar12;
        if (__n == 0) {
LAB_00be62f1:
          bVar9 = uVar7 != uVar8;
        }
        else {
          iVar10 = bcmp(local_638,local_618,__n);
          bVar9 = true;
          if (iVar10 == 0) goto LAB_00be62f1;
        }
        uVar14 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
        TVar5 = local_670;
        if (bVar9 == true && (uVar14 & 0x300) == 0) {
          if (local_63c != 0) {
            tcu::TestLog::startShaderProgram
                      ((TestLog *)local_670,false,
                       "Precision mismatch, pipeline validation status GL_TRUE expected GL_FALSE");
            tcu::TestLog::writeShader
                      ((TestLog *)TVar5,QP_SHADER_TYPE_VERTEX,local_5d0,true,
                       fixed_sample_locations_values + 1);
            tcu::TestLog::writeShader
                      ((TestLog *)TVar5,QP_SHADER_TYPE_FRAGMENT,local_5f8,true,
                       fixed_sample_locations_values + 1);
            tcu::TestLog::endShaderProgram((TestLog *)TVar5);
            pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar16,"InterfaceMatchingCase failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0xac9);
            __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          local_440._0_4_ = local_670.order;
          local_440._4_4_ = local_670.type;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_438,
                     "Precision mismatch, Pipeline validation status GL_FALSE -> OK",0x3d);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_440,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
          std::ios_base::~ios_base(local_3c8);
        }
        else {
          if (local_63c != 1) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_440);
            poVar1 = (ostream *)(local_438 + 8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Precision ",10);
            pcVar18 = "matches";
            if (bVar9 != false) {
              pcVar18 = "mismatch";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar18,(ulong)bVar9 + 7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar1,", pipeline validation status GL_FALSE expected GL_TRUE",0x36);
            std::__cxx11::stringbuf::str();
            tcu::TestLog::startShaderProgram((TestLog *)local_670,false,(char *)local_510._0_8_);
            if (local_510._0_8_ != (long)local_510 + 0x10) {
              operator_delete((void *)local_510._0_8_,local_510._16_8_ + 1);
            }
            TVar5 = local_670;
            tcu::TestLog::writeShader
                      ((TestLog *)local_670,QP_SHADER_TYPE_VERTEX,local_5d0,true,
                       fixed_sample_locations_values + 1);
            tcu::TestLog::writeShader
                      ((TestLog *)TVar5,QP_SHADER_TYPE_FRAGMENT,local_5f8,true,
                       fixed_sample_locations_values + 1);
            tcu::TestLog::endShaderProgram((TestLog *)TVar5);
            pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar16,"InterfaceMatchingCase failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0xadd);
            __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          local_440._0_4_ = local_670.order;
          local_440._4_4_ = local_670.type;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"Precision ",10);
          pcVar18 = "matches";
          if (bVar9 != false) {
            pcVar18 = "mismatch";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_438,pcVar18,(ulong)bVar9 + 7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_438,", pipeline validation status GL_TRUE -> OK",0x2a);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_440,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
          std::ios_base::~ios_base(local_3c8);
          (*gl->clear)(0x4000);
          GVar12 = (*gl->getAttribLocation)(local_67c,"a_position");
          (*gl->vertexAttribPointer)(GVar12,4,0x1406,'\0',0,(void *)0x0);
          (*gl->enableVertexAttribArray)(GVar12);
          p_Var2 = gl->programUniform4f;
          GVar15 = (*gl->getUniformLocation)(local_67c,"u_color");
          (*p_Var2)(local_67c,GVar15,1.0,1.0,1.0,1.0);
          GVar13 = (*gl->getError)();
          glu::checkError(GVar13,"StateInteraction failure, set uniform value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                          ,0xaeb);
          (*gl->drawElements)(4,6,0x1403,(void *)0x0);
          GVar13 = (*gl->getError)();
          glu::checkError(GVar13,"DrawElements failure",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                          ,0xaed);
          (*gl->disableVertexAttribArray)(GVar12);
          pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
          local_510._0_4_ = RGBA;
          local_510._4_4_ = UNORM_INT8;
          pvVar19 = (void *)local_658.m_pixels.m_cap;
          if ((void *)local_658.m_pixels.m_cap != (void *)0x0) {
            pvVar19 = local_658.m_pixels.m_ptr;
          }
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_440,(TextureFormat *)local_510,local_658.m_width,
                     local_658.m_height,1,pvVar19);
          glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_440);
          de::ArrayBuffer<unsigned_int,_4UL,_4UL>::ArrayBuffer
                    (&local_528.m_pixels,&local_658.m_pixels);
          bVar9 = checkSurface(this,&local_528,(RGBA)0xffffffff);
          tcu::Surface::~Surface(&local_528);
          if (!bVar9) {
            pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar16,"InterfaceMatchingCase failed; surface should be white",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0xaf5);
            __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
        }
        pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5b0,local_5d0,&local_671);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_580,local_5f8,&local_672);
        memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_440,0,0xac);
        local_390._0_8_ = (pointer)0x0;
        local_390[8] = 0;
        local_390._9_7_ = 0;
        local_390[0x10] = 0;
        local_390._17_8_ = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_440,&local_5b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_428,&local_580);
        glu::ShaderProgram::ShaderProgram
                  ((ShaderProgram *)local_510,pRVar3,(ProgramSources *)local_440);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_390);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(&local_3b0);
        lVar20 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_438 + lVar20 + -8));
          lVar20 = lVar20 + -0x18;
        } while (lVar20 != -0x18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._M_dataplus._M_p != &local_580.field_2) {
          operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
          operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
        }
        (*gl->useProgram)(local_478);
        p_Var4 = gl->uniform4f;
        GVar15 = (*gl->getUniformLocation)(local_478,"u_color");
        (*p_Var4)(GVar15,1.0,1.0,1.0,1.0);
        if (local_450 == false) {
          glu::operator<<((TestLog *)TVar5,(ShaderProgram *)local_510);
          TVar6 = local_670;
          local_670.order = TVar5.order;
          local_670.type = TVar5.type;
          local_440._0_4_ = local_670.order;
          local_440._4_4_ = local_670.type;
          local_670 = TVar6;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_438,
                     "Non separable program link status GL_FALSE expected GL_TRUE",0x3b);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_440,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
          std::ios_base::~ios_base(local_3c8);
          pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar16,"InterfaceMatchingCase failed, non separable program should link",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0xb06);
          __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        GVar12 = (*gl->getAttribLocation)(local_478,"a_position");
        (*gl->vertexAttribPointer)(GVar12,4,0x1406,'\0',0,(void *)0x0);
        (*gl->enableVertexAttribArray)(GVar12);
        (*gl->drawElements)(4,6,0x1403,(void *)0x0);
        (*gl->disableVertexAttribArray)(GVar12);
        GVar13 = (*gl->getError)();
        glu::checkError(GVar13,"StateInteraction failure, non separable program draw call",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0xb0f);
        pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
        local_5b0._M_dataplus._M_p = (pointer)0x300000008;
        pvVar19 = (void *)local_658.m_pixels.m_cap;
        if ((void *)local_658.m_pixels.m_cap != (void *)0x0) {
          pvVar19 = local_658.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_440,(TextureFormat *)&local_5b0,local_658.m_width,
                   local_658.m_height,1,pvVar19);
        glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_440);
        de::ArrayBuffer<unsigned_int,_4UL,_4UL>::ArrayBuffer
                  (&local_540.m_pixels,&local_658.m_pixels);
        bVar9 = checkSurface(this,&local_540,(RGBA)0xffffffff);
        tcu::Surface::~Surface(&local_540);
        if (!bVar9) {
          pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar16,
                     "InterfaceMatchingCase failed, non separable program, unexpected color found",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0xb14);
          __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (*gl->deleteProgram)(local_67c);
        (*gl->deleteProgram)(local_678);
        (*gl->useProgram)(0);
        glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_510);
      }
      if (local_638 != local_628) {
        operator_delete(local_638,local_628[0] + 1);
      }
      lVar20 = local_588 + 1;
    } while (lVar20 != 7);
    if (local_618 != local_608) {
      operator_delete(local_618,local_608[0] + 1);
    }
    lVar20 = local_590 + 1;
    if (lVar20 == 7) {
      (*gl->bindVertexArray)(0);
      (*gl->deleteVertexArrays)(1,&local_65c);
      (*gl->deleteBuffers)(1,&local_664);
      (*gl->deleteBuffers)(1,&local_660);
      (*gl->bindProgramPipeline)(0);
      (*gl->deleteProgramPipelines)(1,&local_680);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      lVar20 = -0x118;
      do {
        if (plVar21 != (long *)plVar21[-2]) {
          operator_delete((long *)plVar21[-2],*plVar21 + 1);
        }
        plVar21 = plVar21 + -5;
        lVar20 = lVar20 + 0x28;
      } while (lVar20 != 0);
      lVar20 = -0x118;
      do {
        if (plVar17 != (long *)plVar17[-2]) {
          operator_delete((long *)plVar17[-2],*plVar17 + 1);
        }
        plVar17 = plVar17 + -5;
        lVar20 = lVar20 + 0x28;
      } while (lVar20 != 0);
      if (local_560 != &local_550) {
        operator_delete(local_560,CONCAT71(uStack_54f,local_550) + 1);
      }
      if (local_5f8 != &local_5e8) {
        operator_delete(local_5f8,CONCAT71(uStack_5e7,local_5e8) + 1);
      }
      if (local_5d0 != &local_5c0) {
        operator_delete(local_5d0,CONCAT71(uStack_5bf,local_5c0) + 1);
      }
      tcu::Surface::~Surface(&local_658);
      return STOP;
    }
  } while( true );
}

Assistant:

IterateResult iterate(void)
	{
		TestLog&				 log		  = m_testCtx.getLog();
		const glw::Functions&	gl			  = m_context.getRenderContext().getFunctions();
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		int						 viewportW	= de::min(16, renderTarget.getWidth());
		int						 viewportH	= de::min(16, renderTarget.getHeight());
		tcu::Surface			 renderedFrame(viewportW, viewportH);

		glw::GLuint programA, programB;
		glw::GLuint vao, vertexBuf, indexBuf;
		std::string vtx;
		std::string frag, frag2;
		glw::GLuint pipeline;
		const char* srcStrings[1];
		glw::GLuint value;

		gl.viewport(0, 0, viewportW, viewportH);
		gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);

		static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };
		const float			  position[]	= { -1.0f, -1.0f, +1.0f, 1.0f, -1.0f, +1.0f, 0.0f,  1.0f,
								   +1.0f, -1.0f, 0.0f,  1.0f, +1.0f, +1.0f, -1.0f, 1.0f };

		/* Set up a vertex array object */
		gl.genVertexArrays(1, &vao);
		gl.bindVertexArray(vao);

		gl.genBuffers(1, &indexBuf);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, indexBuf);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(quadIndices), quadIndices, GL_STATIC_DRAW);

		gl.genBuffers(1, &vertexBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, vertexBuf);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(position), position, GL_STATIC_DRAW);

		/* Set up shader pipeline */
		gl.genProgramPipelines(1, &pipeline);
		gl.bindProgramPipeline(pipeline);

		struct PrecisionTests
		{
			TestType	testType;
			std::string precision;
		};

		PrecisionTests vertexPrecisionTests[] = {
			{ DEFAULT_PRECISION, "highp" },	{ SET_DEFAULT_PRECISION, "highp" }, { SET_DEFAULT_PRECISION, "mediump" },
			{ SET_DEFAULT_PRECISION, "lowp" }, { SET_PRECISION, "highp" },		   { SET_PRECISION, "mediump" },
			{ SET_PRECISION, "lowp" }
		};

		PrecisionTests fragmentPrecisionTests[] = { { DEFAULT_PRECISION, getDefaultFragmentPrecision() },
													{ SET_DEFAULT_PRECISION, "highp" },
													{ SET_DEFAULT_PRECISION, "mediump" },
													{ SET_DEFAULT_PRECISION, "lowp" },
													{ SET_PRECISION, "highp" },
													{ SET_PRECISION, "mediump" },
													{ SET_PRECISION, "lowp" } };

		// Shader interface matching inputs/outputs precision
		int maxTests = 7;
		for (int vertexTestIteration = 0; vertexTestIteration < maxTests; vertexTestIteration++)
		{
			std::string vertexPrecision = vertexPrecisionTests[vertexTestIteration].precision;
			TestType	vertexTestType  = vertexPrecisionTests[vertexTestIteration].testType;
			for (int fragmentTestIteration = 0; fragmentTestIteration < maxTests; fragmentTestIteration++)
			{
				std::string fragmentPrecision = fragmentPrecisionTests[fragmentTestIteration].precision;
				TestType	fragmentTestType  = fragmentPrecisionTests[fragmentTestIteration].testType;
				if (fragmentPrecision.empty())
					continue;

				log << TestLog::Message << "vertex shader precision: " << vertexPrecision
					<< ", shader test mode: " << getTestTypeName(vertexTestType) << TestLog::EndMessage;

				log << TestLog::Message << "fragment shader precision: " << fragmentPrecision
					<< ", shader test mode: " << getTestTypeName(fragmentTestType) << TestLog::EndMessage;

				generateVarLinkVertexShaderSrc(vtx, m_glslVersion, vertexPrecision, vertexTestType);
				generateVarLinkFragmentShaderSrc(frag, m_glslVersion, fragmentPrecision, fragmentTestType);

				srcStrings[0] = vtx.c_str();
				programA	  = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, srcStrings);
				if (!checkCSProg(gl, programA))
				{
					TCU_FAIL("CreateShaderProgramv failed for vertex shader");
				}
				srcStrings[0] = frag.c_str();
				programB	  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, srcStrings);
				if (!checkCSProg(gl, programB))
				{
					TCU_FAIL("CreateShaderProgramv failed for fragment shader");
				}

				gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programA);
				gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);
				GLU_EXPECT_NO_ERROR(gl.getError(), "InterfaceMatching failure");

				// Mismatched input and output qualifiers
				// For OpenGL ES contexts, this should result in a validation failure.
				// For OpenGL contexts, validation should succeed.
				gl.validateProgramPipeline(pipeline);
				gl.getProgramPipelineiv(pipeline, GL_VALIDATE_STATUS, (glw::GLint*)&value);
				int precisionCompareResult = fragmentPrecision.compare(vertexPrecision);
				if (glu::isContextTypeES(m_context.getRenderContext().getType()) && (precisionCompareResult != 0))
				{
					// precision mismatch
					if (value != GL_FALSE)
					{
						log.startShaderProgram(
							false, "Precision mismatch, pipeline validation status GL_TRUE expected GL_FALSE");
						log.writeShader(QP_SHADER_TYPE_VERTEX, vtx.c_str(), true, "");
						log.writeShader(QP_SHADER_TYPE_FRAGMENT, frag.c_str(), true, "");
						log.endShaderProgram();
						TCU_FAIL("InterfaceMatchingCase failed");
					}
					else
					{
						log << TestLog::Message << "Precision mismatch, Pipeline validation status GL_FALSE -> OK"
							<< TestLog::EndMessage;
					}
				}
				else
				{
					if (value != GL_TRUE)
					{
						std::stringstream str;
						str << "Precision " << (precisionCompareResult ? "mismatch" : "matches")
							<< ", pipeline validation status GL_FALSE expected GL_TRUE";

						log.startShaderProgram(false, str.str().c_str());
						log.writeShader(QP_SHADER_TYPE_VERTEX, vtx.c_str(), true, "");
						log.writeShader(QP_SHADER_TYPE_FRAGMENT, frag.c_str(), true, "");
						log.endShaderProgram();
						TCU_FAIL("InterfaceMatchingCase failed");
					}
					else
					{
						log << TestLog::Message << "Precision " << (precisionCompareResult ? "mismatch" : "matches")
							<< ", pipeline validation status GL_TRUE -> OK" << TestLog::EndMessage;
						// precision matches
						gl.clear(GL_COLOR_BUFFER_BIT);
						// white
						int posLoc = gl.getAttribLocation(programA, "a_position");
						gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, 0);
						gl.enableVertexAttribArray(posLoc);
						gl.programUniform4f(programA, gl.getUniformLocation(programA, "u_color"), 1.0f, 1.0f, 1.0f,
											1.0f);
						GLU_EXPECT_NO_ERROR(gl.getError(), "StateInteraction failure, set uniform value");
						gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
						GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");
						gl.disableVertexAttribArray(posLoc);

						glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

						// expect white
						if (!checkSurface(renderedFrame, tcu::RGBA::white()))
						{
							TCU_FAIL("InterfaceMatchingCase failed; surface should be white");
						}
					}
				}

				// validate non separable program

				glu::ShaderProgram progVF(m_context.getRenderContext(),
										  glu::makeVtxFragSources(vtx.c_str(), frag.c_str()));

				gl.useProgram(progVF.getProgram());
				gl.uniform4f(gl.getUniformLocation(progVF.getProgram(), "u_color"), 1.0f, 1.0f, 1.0f, 1.0f);
				if (!progVF.getProgramInfo().linkOk)
				{
					log << progVF;
					log << TestLog::Message << "Non separable program link status GL_FALSE expected GL_TRUE"
						<< TestLog::EndMessage;
					TCU_FAIL("InterfaceMatchingCase failed, non separable program should link");
				}

				int posLoc = gl.getAttribLocation(progVF.getProgram(), "a_position");
				gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, 0);
				gl.enableVertexAttribArray(posLoc);
				gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
				gl.disableVertexAttribArray(posLoc);

				GLU_EXPECT_NO_ERROR(gl.getError(), "StateInteraction failure, non separable program draw call");
				glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());
				// expect white
				if (!checkSurface(renderedFrame, tcu::RGBA::white()))
				{
					TCU_FAIL("InterfaceMatchingCase failed, non separable program, unexpected color found");
				}

				gl.deleteProgram(programA);
				gl.deleteProgram(programB);
				gl.useProgram(0);
			}
		}
		gl.bindVertexArray(0);
		gl.deleteVertexArrays(1, &vao);
		gl.deleteBuffers(1, &indexBuf);
		gl.deleteBuffers(1, &vertexBuf);
		gl.bindProgramPipeline(0);
		gl.deleteProgramPipelines(1, &pipeline);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}